

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegexpExec(xmlRegexpPtr comp,xmlChar *content)

{
  int iVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegStatePtr pxVar3;
  void *pvVar4;
  xmlRegStatePtr pxVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  xmlRegTrans *pxVar9;
  xmlRegExecRollback *pxVar10;
  int i;
  long lVar11;
  bool bVar12;
  int local_cc;
  xmlRegExecCtxt execval;
  
  if (content == (xmlChar *)0x0 || comp == (xmlRegexpPtr)0x0) {
    return -1;
  }
  execval.index = 0;
  execval.nbPush = 0;
  execval.status = 0;
  execval.determinist = 1;
  execval.maxRollbacks = 0;
  execval.nbRollbacks = 0;
  execval.rollbacks = (xmlRegExecRollback *)0x0;
  execval.state = *comp->states;
  execval.transno = 0;
  execval.transcount = 0;
  execval.inputStack = (xmlRegInputTokenPtr)0x0;
  execval.inputStackMax = 0;
  execval.comp = comp;
  execval.inputString = content;
  if ((long)comp->nbCounters < 1) {
    execval.counts = (int *)0x0;
  }
  else {
    execval.counts = (int *)(*xmlMalloc)((long)comp->nbCounters << 2);
    if (execval.counts == (int *)0x0) {
      return -5;
    }
    memset(execval.counts,0,(long)comp->nbCounters << 2);
  }
  iVar6 = 0;
LAB_00176346:
  if (((iVar6 != 0) || (execval.state == (xmlRegStatePtr)0x0)) ||
     ((execval.inputString[execval.index] == '\0' &&
      ((execval.state)->type == XML_REGEXP_FINAL_STATE)))) {
LAB_00176767:
    if (execval.rollbacks != (xmlRegExecRollback *)0x0) {
      pxVar10 = execval.rollbacks;
      if (execval.counts != (int *)0x0) {
        lVar8 = 0x10;
        for (lVar11 = 0; lVar11 < execval.maxRollbacks; lVar11 = lVar11 + 1) {
          pvVar4 = *(void **)((long)&pxVar10->state + lVar8);
          if (pvVar4 != (void *)0x0) {
            (*xmlFree)(pvVar4);
            pxVar10 = execval.rollbacks;
          }
          lVar8 = lVar8 + 0x18;
        }
      }
      (*xmlFree)(pxVar10);
    }
    if (execval.state == (xmlRegStatePtr)0x0) {
      execval.status = -4;
    }
    else {
      if (execval.counts != (int *)0x0) {
        (*xmlFree)(execval.counts);
      }
      if (execval.status == 0) {
        execval.status = 1;
      }
      else if (execval.status == -1) {
        execval.status = 0;
      }
    }
    return execval.status;
  }
  local_cc = 1;
  if ((execval.inputString[execval.index] != '\0') || (execval.counts != (int *)0x0)) {
LAB_001763c4:
    execval.transcount = 0;
LAB_001763c9:
    if ((execval.state)->nbTrans <= execval.transno) goto LAB_00176725;
    if ((execval.state)->trans[execval.transno].to < 0) goto LAB_00176683;
    pxVar9 = (execval.state)->trans + execval.transno;
    lVar8 = (long)pxVar9->count;
    if (-1 < lVar8) {
      if (execval.counts == (int *)0x0) {
LAB_0017674e:
        execval.status = -4;
        goto LAB_00176767;
      }
      iVar6 = (execval.comp)->counters[lVar8].min;
      if ((execval.counts[lVar8] < iVar6) ||
         (iVar1 = (execval.comp)->counters[lVar8].max, iVar1 < execval.counts[lVar8]))
      goto LAB_00176683;
      bVar12 = iVar6 != iVar1;
LAB_00176601:
      if ((pxVar9->nd == 1) ||
         ((bVar12 && -1 < pxVar9->count && (execval.transno + 1 < (execval.state)->nbTrans)))) {
        xmlFARegExecSave(&execval);
        if (execval.status != 0) goto LAB_00176767;
      }
      lVar8 = (long)pxVar9->counter;
      if (-1 < lVar8) {
        if (((execval.counts == (int *)0x0) || (execval.comp == (xmlRegexpPtr)0x0)) ||
           ((execval.comp)->counters == (xmlRegCounter *)0x0)) goto LAB_0017674e;
        if ((execval.comp)->counters[lVar8].max <= execval.counts[lVar8]) goto LAB_00176683;
        execval.counts[lVar8] = execval.counts[lVar8] + 1;
      }
      if ((ulong)(uint)pxVar9->count < 0x123456) {
        if (execval.counts == (int *)0x0) goto LAB_0017674e;
        execval.counts[(uint)pxVar9->count] = 0;
      }
      execval.state = comp->states[pxVar9->to];
      execval.transno = 0;
      if (pxVar9->atom != (xmlRegAtomPtr)0x0) {
        execval.index = execval.index + local_cc;
      }
      goto LAB_00176738;
    }
    pxVar2 = pxVar9->atom;
    if (pxVar2 == (xmlRegAtomPtr)0x0) {
LAB_0017671d:
      execval.status = -4;
      goto LAB_00176725;
    }
    if (execval.inputString[execval.index] == '\0') {
LAB_001765da:
      if ((pxVar2->min == 0) && (0 < pxVar2->max)) {
        execval.transcount = 1;
        local_cc = 0;
LAB_001765ff:
        bVar12 = false;
        goto LAB_00176601;
      }
    }
    else {
      local_cc = 4;
      iVar6 = xmlGetUTF8Char(execval.inputString + execval.index,&local_cc);
      if (iVar6 < 0) {
LAB_0017675f:
        execval.status = -7;
        goto LAB_00176767;
      }
      iVar6 = xmlRegCheckCharacter(pxVar2,iVar6);
      if (iVar6 == 0) goto LAB_001765da;
      if (iVar6 == 1) {
        if ((-1 < pxVar2->min) && (0 < pxVar2->max)) {
          pxVar3 = comp->states[pxVar9->to];
          uVar7 = pxVar9->counter;
          lVar8 = (long)(int)uVar7;
          if (-1 < lVar8) {
            if (((execval.counts == (int *)0x0) || (execval.comp == (xmlRegexpPtr)0x0)) ||
               ((execval.comp)->counters == (xmlRegCounter *)0x0)) goto LAB_0017674e;
            if ((execval.comp)->counters[lVar8].max <= execval.counts[lVar8]) goto LAB_00176683;
          }
          if (execval.transno + 1 < (execval.state)->nbTrans) {
            xmlFARegExecSave(&execval);
            if (execval.status != 0) goto LAB_00176767;
            uVar7 = pxVar9->counter;
          }
          if (-1 < (int)uVar7) {
            execval.counts[uVar7] = execval.counts[uVar7] + 1;
          }
          execval.transcount = 1;
          do {
            iVar6 = execval.transno;
            pxVar5 = execval.state;
            if (execval.transcount == pxVar2->max) {
LAB_0017669b:
              iVar6 = 1;
              break;
            }
            lVar8 = (long)local_cc + (long)execval.index;
            if (execval.inputString[lVar8] == '\0') goto LAB_0017669b;
            execval.index = (int)lVar8;
            if (pxVar2->min <= execval.transcount) {
              execval.transno = -1;
              execval.state = pxVar3;
              xmlFARegExecSave(&execval);
              if (execval.status != 0) goto LAB_00176767;
              lVar8 = (long)execval.index;
            }
            local_cc = 4;
            execval.state = pxVar5;
            execval.transno = iVar6;
            iVar6 = xmlGetUTF8Char(execval.inputString + lVar8,&local_cc);
            if (iVar6 < 0) goto LAB_0017675f;
            iVar6 = xmlRegCheckCharacter(pxVar2,iVar6);
            execval.transcount = execval.transcount + 1;
          } while (iVar6 == 1);
          if (execval.transcount < pxVar2->min) {
            iVar6 = 0;
          }
          if (0 < iVar6) {
            if (-1 < (long)pxVar9->counter) {
              if (execval.counts == (int *)0x0) goto LAB_0017674e;
              execval.counts[pxVar9->counter] = execval.counts[pxVar9->counter] + -1;
            }
            if (iVar6 != 1) goto LAB_00176683;
            goto LAB_001765ff;
          }
          goto LAB_00176729;
        }
        goto LAB_001765ff;
      }
      if (iVar6 < 0) goto LAB_0017671d;
    }
LAB_00176683:
    execval.transno = execval.transno + 1;
    goto LAB_001763c9;
  }
  if (execval.transno < (execval.state)->nbTrans) {
    if (((execval.state)->trans[execval.transno].to < 0) ||
       ((pxVar2 = (execval.state)->trans[execval.transno].atom, pxVar2->min == 0 &&
        (0 < pxVar2->max)))) goto LAB_001763c4;
  }
  goto LAB_00176729;
LAB_00176725:
  if ((execval.transno != 0) || ((execval.state)->nbTrans == 0)) {
LAB_00176729:
    execval._0_8_ = execval._0_8_ & 0xffffffff;
    xmlFARegExecRollBack(&execval);
  }
LAB_00176738:
  iVar6 = execval.status;
  goto LAB_00176346;
}

Assistant:

int
xmlRegexpExec(xmlRegexpPtr comp, const xmlChar *content) {
    if ((comp == NULL) || (content == NULL))
	return(-1);
    return(xmlFARegExec(comp, content));
}